

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator==
               (Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                *c1,Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>
                    *c2)

{
  bool bVar1;
  Column_support *local_10;
  node_ptr local_8;
  
  if (c1 != c2) {
    local_8 = *(node_ptr *)
               ((long)&(c1->column_).super_type.
                       super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
               + 8);
    local_10 = &c1->column_;
    bVar1 = boost::intrusive::
            algo_equal<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::Matrix_column_tag,3u>,true>,boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::Matrix_column_tag,3u>,true>,boost::intrusive::algo_pred_equal>
                      (&local_8,&local_10);
    return bVar1;
  }
  return true;
}

Assistant:

bool operator==(const Intrusive_set_column& c1, const Intrusive_set_column& c2) {
    if (&c1 == &c2) return true;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ == c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      if (c1.column_.size() != c2.column_.size()) return false;
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index() || it1->get_element() != it2->get_element()) return false;
        ++it1;
        ++it2;
      }
      return true;
    }
  }